

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmTargetExport *name;
  const_iterator exportSet_00;
  bool bVar1;
  bool exportOld_00;
  uint uVar2;
  PolicyStatus PVar3;
  MessageLevel message_00;
  const_reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  ulong uVar7;
  string *psVar8;
  long lVar9;
  cmGlobalGenerator *pcVar10;
  cmExportSetMap *this_00;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar11;
  reference ppcVar12;
  cmTarget *this_01;
  cmInstallExportGenerator *this_02;
  char *destination;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  char *filename_00;
  char *name_space_00;
  bool local_1109;
  cmInstallExportGenerator *exportGenerator;
  undefined1 local_1080 [4];
  MessageLevel message;
  undefined1 local_1060 [8];
  ostringstream e_5;
  bool newCMP0022Behavior;
  cmTarget *tgt;
  cmTargetExport *te;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_ec8;
  const_iterator tei;
  cmExportSet *exportSet;
  undefined1 local_e98 [8];
  ostringstream e_4;
  string local_d20;
  undefined1 local_d00 [8];
  ostringstream e_3;
  string local_b80;
  string local_b60;
  undefined1 local_b40 [8];
  ostringstream e_2;
  undefined1 local_9c8 [8];
  string fname;
  undefined1 local_988 [8];
  ostringstream e_1;
  string local_808;
  undefined1 local_7e8 [8];
  ostringstream e;
  undefined1 local_670 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmCAString filename;
  cmCAEnabler exportOld;
  cmCAString name_space;
  undefined1 local_500 [8];
  cmCAString exp;
  cmInstallCommandArguments ica;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  ica.DefaultComponentName.field_2._8_8_ = args;
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)&exp.DataStart,&this->DefaultComponentName);
  cmCAString::cmCAString
            ((cmCAString *)local_500,(cmCommandArgumentsHelper *)&exp.DataStart,"EXPORT",
             (cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString
            ((cmCAString *)&exportOld.Enabled,(cmCommandArgumentsHelper *)&exp.DataStart,"NAMESPACE"
             ,(cmCommandArgumentGroup *)
              &ica.Parser.Arguments.
               super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::cmCAEnabler
            ((cmCAEnabler *)&filename.DataStart,(cmCommandArgumentsHelper *)&exp.DataStart,
             "EXPORT_LINK_INTERFACE_LIBRARIES",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCAString::cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmCommandArgumentsHelper *)&exp.DataStart,"FILE",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCommandArgument::Follows((cmCommandArgument *)local_500,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows
            ((cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(cmCommandArgument *)local_500);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_670);
  cmInstallCommandArguments::Parse
            ((cmInstallCommandArguments *)&exp.DataStart,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ica.DefaultComponentName.field_2._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_670);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_670);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7e8);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_7e8,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given unknown argument \"");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_670,0);
    poVar5 = std::operator<<(poVar5,(string *)pvVar6);
    std::operator<<(poVar5,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_808);
    std::__cxx11::string::~string((string *)&local_808);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7e8);
    goto LAB_005ed706;
  }
  bVar1 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)&exp.DataStart);
  if (!bVar1) {
    this_local._7_1_ = false;
    goto LAB_005ed706;
  }
  cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)&exp.DataStart);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_988);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_988,(string *)pvVar4);
    std::operator<<(poVar5," given no DESTINATION!");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)((long)&fname.field_2 + 8));
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_988);
    goto LAB_005ed706;
  }
  psVar8 = cmCAString::GetString_abi_cxx11_
                     ((cmCAString *)
                      &unknownArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_9c8,(string *)psVar8);
  lVar9 = std::__cxx11::string::find_first_of(local_9c8,0xa2b8d0);
  if (lVar9 == -1) {
    uVar2 = std::__cxx11::string::empty();
    local_1109 = false;
    if ((uVar2 & 1) == 0) {
      cmsys::SystemTools::GetFilenameLastExtension(&local_b80,(string *)local_9c8);
      local_1109 = std::operator!=(&local_b80,".cmake");
      std::__cxx11::string::~string((string *)&local_b80);
    }
    if (local_1109 == false) {
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) != 0) {
        psVar8 = cmCAString::GetString_abi_cxx11_((cmCAString *)local_500);
        std::__cxx11::string::operator=((string *)local_9c8,(string *)psVar8);
        std::__cxx11::string::operator+=((string *)local_9c8,".cmake");
        lVar9 = std::__cxx11::string::find_first_of(local_9c8,0xa2b8d0);
        if (lVar9 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e98);
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)ica.DefaultComponentName.field_2._8_8_,0);
          poVar5 = std::operator<<((ostream *)local_e98,(string *)pvVar4);
          poVar5 = std::operator<<(poVar5," given export name \"");
          psVar8 = cmCAString::GetString_abi_cxx11_((cmCAString *)local_500);
          poVar5 = std::operator<<(poVar5,(string *)psVar8);
          poVar5 = std::operator<<(poVar5,"\".  ");
          poVar5 = std::operator<<(poVar5,"This name cannot be safely converted to a file name.  ");
          poVar5 = std::operator<<(poVar5,
                                   "Specify a different export name or use the FILE option to set ")
          ;
          std::operator<<(poVar5,"a file name explicitly.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&exportSet);
          std::__cxx11::string::~string((string *)&exportSet);
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e98);
          goto LAB_005ed6ea;
        }
      }
      pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      this_00 = cmGlobalGenerator::GetExportSets(pcVar10);
      psVar8 = cmCAString::GetString_abi_cxx11_((cmCAString *)local_500);
      tei._M_current = (cmTargetExport **)cmExportSetMap::operator[](this_00,psVar8);
      bVar1 = cmCAEnabler::IsEnabled((cmCAEnabler *)&filename.DataStart);
      if (bVar1) {
        pvVar11 = cmExportSet::GetTargetExports((cmExportSet *)tei._M_current);
        local_ec8._M_current =
             (cmTargetExport **)
             std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar11);
        while( true ) {
          pvVar11 = cmExportSet::GetTargetExports((cmExportSet *)tei._M_current);
          te = (cmTargetExport *)
               std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar11);
          bVar1 = __gnu_cxx::operator!=
                            (&local_ec8,
                             (__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                              *)&te);
          if (!bVar1) break;
          ppcVar12 = __gnu_cxx::
                     __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                     ::operator*(&local_ec8);
          name = *ppcVar12;
          pcVar10 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          this_01 = cmGlobalGenerator::FindTarget(pcVar10,&name->TargetName,false);
          bVar1 = false;
          if (this_01 != (cmTarget *)0x0) {
            PVar3 = cmTarget::GetPolicyStatusCMP0022(this_01);
            bVar1 = false;
            if (PVar3 != WARN) {
              PVar3 = cmTarget::GetPolicyStatusCMP0022(this_01);
              bVar1 = PVar3 != OLD;
            }
          }
          if (!bVar1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1060);
            poVar5 = std::operator<<((ostream *)local_1060,"INSTALL(EXPORT) given keyword \"");
            poVar5 = std::operator<<(poVar5,"EXPORT_LINK_INTERFACE_LIBRARIES");
            poVar5 = std::operator<<(poVar5,"\", but target \"");
            poVar5 = std::operator<<(poVar5,(string *)name);
            std::operator<<(poVar5,"\" does not have policy CMP0022 set to NEW.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1080);
            std::__cxx11::string::~string((string *)local_1080);
            this_local._7_1_ = false;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1060);
            goto LAB_005ed6ea;
          }
          __gnu_cxx::
          __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
          ::operator++(&local_ec8);
        }
      }
      message_00 = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
      this_02 = (cmInstallExportGenerator *)operator_new(0x178);
      exportSet_00 = tei;
      cmInstallCommandArguments::GetDestination_abi_cxx11_
                ((cmInstallCommandArguments *)&exp.DataStart);
      destination = (char *)std::__cxx11::string::c_str();
      cmInstallCommandArguments::GetPermissions_abi_cxx11_
                ((cmInstallCommandArguments *)&exp.DataStart);
      file_permissions = (char *)std::__cxx11::string::c_str();
      configurations =
           cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                     ((cmInstallCommandArguments *)&exp.DataStart);
      cmInstallCommandArguments::GetComponent_abi_cxx11_
                ((cmInstallCommandArguments *)&exp.DataStart);
      component = (char *)std::__cxx11::string::c_str();
      bVar1 = cmInstallCommandArguments::GetExcludeFromAll
                        ((cmInstallCommandArguments *)&exp.DataStart);
      filename_00 = (char *)std::__cxx11::string::c_str();
      name_space_00 = cmCAString::GetCString((cmCAString *)&exportOld.Enabled);
      exportOld_00 = cmCAEnabler::IsEnabled((cmCAEnabler *)&filename.DataStart);
      cmInstallExportGenerator::cmInstallExportGenerator
                (this_02,(cmExportSet *)exportSet_00._M_current,destination,file_permissions,
                 configurations,component,message_00,bVar1,filename_00,name_space_00,exportOld_00,
                 false);
      cmMakefile::AddInstallGenerator
                ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_02);
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d00);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)ica.DefaultComponentName.field_2._8_8_,0);
      poVar5 = std::operator<<((ostream *)local_d00,(string *)pvVar4);
      poVar5 = std::operator<<(poVar5," given invalid export file name \"");
      poVar5 = std::operator<<(poVar5,(string *)local_9c8);
      poVar5 = std::operator<<(poVar5,"\".  ");
      std::operator<<(poVar5,"The FILE argument must specify a name ending in \".cmake\".");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_d20);
      std::__cxx11::string::~string((string *)&local_d20);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d00);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b40);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar5 = std::operator<<((ostream *)local_b40,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given invalid export file name \"");
    poVar5 = std::operator<<(poVar5,(string *)local_9c8);
    poVar5 = std::operator<<(poVar5,"\".  ");
    poVar5 = std::operator<<(poVar5,"The FILE argument may not contain a path.  ");
    std::operator<<(poVar5,"Specify the path in the DESTINATION argument.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_b60);
    std::__cxx11::string::~string((string *)&local_b60);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b40);
  }
LAB_005ed6ea:
  std::__cxx11::string::~string((string *)local_9c8);
LAB_005ed706:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_670);
  cmCAString::~cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::~cmCAEnabler((cmCAEnabler *)&filename.DataStart);
  cmCAString::~cmCAString((cmCAString *)&exportOld.Enabled);
  cmCAString::~cmCAString((cmCAString *)local_500);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)&exp.DataStart)
  ;
  return this_local._7_1_;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(CM_NULLPTR);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Check the file name.
  std::string fname = filename.GetString();
  if (fname.find_first_of(":/\\") != std::string::npos) {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".cmake") {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
  }

  // Construct the file name.
  if (fname.empty()) {
    fname = exp.GetString();
    fname += ".cmake";

    if (fname.find_first_of(":/\\") != std::string::npos) {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp.GetString() << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
    }
  }

  cmExportSet* exportSet =
    this->Makefile->GetGlobalGenerator()->GetExportSets()[exp.GetString()];
  if (exportOld.IsEnabled()) {
    for (std::vector<cmTargetExport*>::const_iterator tei =
           exportSet->GetTargetExports()->begin();
         tei != exportSet->GetTargetExports()->end(); ++tei) {
      cmTargetExport const* te = *tei;
      cmTarget* tgt =
        this->Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt && tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if (!newCMP0022Behavior) {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES"
          << "\", but target \"" << te->TargetName
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
      }
    }
  }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator = new cmInstallExportGenerator(
    exportSet, ica.GetDestination().c_str(), ica.GetPermissions().c_str(),
    ica.GetConfigurations(), ica.GetComponent().c_str(), message,
    ica.GetExcludeFromAll(), fname.c_str(), name_space.GetCString(),
    exportOld.IsEnabled(), false);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}